

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  bool bVar3;
  cmConditionEvaluator *pcVar4;
  iterator argP2;
  iterator arg;
  int reducible;
  iterator argP1;
  iterator local_90;
  iterator local_88;
  int local_7c;
  iterator local_78;
  string local_70;
  string local_50;
  
  do {
    local_7c = 0;
    local_88._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_90._M_node = (_List_node_base *)0x0;
    for (; local_88._M_node != (_List_node_base *)newArgs;
        local_88._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_88._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_78._M_node = local_88._M_node;
      if ((local_88._M_node != (_List_node_base *)newArgs) &&
         (local_78._M_node = (local_88._M_node)->_M_next, local_90._M_node = local_78._M_node,
         local_78._M_node != (_List_node_base *)newArgs)) {
        local_90._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_78._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      }
      iVar1._M_node = local_78._M_node;
      if (local_78._M_node == (_List_node_base *)newArgs) {
LAB_00270148:
        bVar2 = false;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AND","");
        bVar2 = IsKeyword(this,&local_70,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
        if (!bVar2) goto LAB_00270148;
        bVar2 = local_90._M_node != (_List_node_base *)newArgs;
      }
      if ((iVar1._M_node != (_List_node_base *)newArgs) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        bVar2 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(local_88._M_node + 1),errorString,
                           status,false);
        pcVar4 = this;
        bVar3 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(local_90._M_node + 1),errorString,
                           status,false);
        HandleBinaryOp(pcVar4,bVar3 && bVar2,&local_7c,&local_88,newArgs,&local_78,&local_90);
      }
      iVar1._M_node = local_78._M_node;
      if (local_78._M_node == (_List_node_base *)newArgs) {
LAB_0027021a:
        bVar2 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"OR","");
        bVar2 = IsKeyword(this,&local_50,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
        if (!bVar2) goto LAB_0027021a;
        bVar2 = local_90._M_node != (_List_node_base *)newArgs;
      }
      if ((iVar1._M_node != (_List_node_base *)newArgs) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        bVar2 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(local_88._M_node + 1),errorString,
                           status,false);
        pcVar4 = this;
        bVar3 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(local_90._M_node + 1),errorString,
                           status,false);
        HandleBinaryOp(pcVar4,bVar3 || bVar2,&local_7c,&local_88,newArgs,&local_78,&local_90);
      }
    }
    if (local_7c == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("AND", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs && rhs),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && this->IsKeyword("OR", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs || rhs),
          reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}